

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *
duckdb::EquiWidthBinsTimestamp::Operation
          (vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true> *__return_storage_ptr__,
          Expression *expr,timestamp_t input_min,timestamp_t input_max,idx_t bin_count,
          bool nice_rounding)

{
  iterator iVar1;
  interval_t step;
  bool bVar2;
  timestamp_t tVar3;
  InvalidInputException *this;
  long lVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar5;
  undefined8 uVar6;
  PrimitiveType<long> *val;
  pointer pPVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double __x;
  double dVar10;
  interval_t iVar11;
  interval_t iVar12;
  int micros;
  int64_t iVar13;
  int32_t min_year;
  int32_t local_d8;
  int32_t local_d4;
  uint local_d0;
  int32_t max_micros;
  int32_t max_sec;
  int32_t max_minute;
  int32_t min_micros;
  int32_t min_sec;
  int32_t min_minute;
  int32_t min_hour;
  int32_t min_day;
  int32_t min_month;
  double local_a8;
  vector<duckdb::PrimitiveType<long>,_true> interpolated_values;
  int32_t max_hour;
  int32_t max_day;
  int32_t max_month;
  int32_t max_year;
  interval_t local_58;
  double local_48;
  double dStack_40;
  
  bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input_min);
  if ((bVar2) && (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(input_max), bVar2)) {
    if (nice_rounding) {
      GetTimestampComponents
                (input_min,&min_year,&min_month,&min_day,&min_hour,&min_minute,&min_sec,&min_micros)
      ;
      GetTimestampComponents
                (input_max,&max_year,&max_month,&max_day,&max_hour,&max_minute,&max_sec,&max_micros)
      ;
      local_d0 = max_year;
      local_d4 = max_month;
      local_d8 = max_day;
      lVar4 = ((long)max_sec - (long)min_sec) * 1000000;
      lVar5 = ((long)max_micros - (long)min_micros) + lVar4;
      auVar8._8_4_ = (int)(bin_count >> 0x20);
      auVar8._0_8_ = bin_count;
      auVar8._12_4_ = 0x45300000;
      dVar9 = auVar8._8_8_ - 1.9342813113834067e+25;
      dVar10 = dVar9 + ((double)CONCAT44(0x43300000,(int)bin_count) - 4503599627370496.0);
      local_a8 = (double)((max_month - min_month) + (max_year - min_year) * 0xc) / dVar10;
      __x = (double)(max_day - min_day) / (double)(int)bin_count;
      if (0.0 < local_a8) {
        local_48 = dVar10;
        dStack_40 = dVar9;
        dVar10 = floor(local_a8);
        __x = __x + (local_a8 - dVar10) * 30.0;
        lVar4 = extraout_RDX;
        dVar10 = local_48;
      }
      dVar10 = (double)(lVar5 + ((long)max_minute - (long)min_minute) * 60000000 +
                                ((long)max_hour - (long)min_hour) * 3600000000) / dVar10;
      if (0.0 < __x) {
        dVar9 = floor(__x);
        dVar10 = dVar10 + (__x - dVar9) * 86400000000.0;
        lVar4 = extraout_RDX_00;
      }
      iVar12._0_8_ = (long)dVar10;
      iVar13 = 0x676783;
      iVar12.micros = lVar4;
      iVar12 = MakeIntervalNice((duckdb *)CONCAT44((int)__x,(int)local_a8),iVar12);
      lVar5 = iVar12.micros;
      micros = iVar12.months;
      step.micros = iVar13;
      step.months = (int)lVar5;
      step.days = (int)((ulong)lVar5 >> 0x20);
      local_58 = iVar12;
      tVar3 = MakeTimestampNice((duckdb *)(ulong)local_d0,local_d4,local_d8,max_hour,max_minute,
                                max_sec,max_micros,micros,step);
      bVar2 = 0 < iVar12.days;
      lVar4 = 1;
      if ((bVar2 || 0 < micros) || 0 < lVar5) {
        lVar4 = lVar5;
      }
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = 0;
      if ((bVar2 || 0 < micros) || 0 < lVar5) {
        uVar6 = iVar12._0_8_;
      }
      while ((input_min.value <= tVar3.value &&
             (iVar1._M_current =
                   (__return_storage_ptr__->
                   super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   ).
                   super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
             (ulong)((long)iVar1._M_current -
                     (long)(__return_storage_ptr__->
                           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                           ).
                           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) < bin_count))) {
        interpolated_values.
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)tVar3.value;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
            ).
            super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
          ::_M_realloc_insert<duckdb::PrimitiveType<duckdb::timestamp_t>>
                    ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
                      *)__return_storage_ptr__,iVar1,
                     (PrimitiveType<duckdb::timestamp_t> *)&interpolated_values);
        }
        else {
          ((iVar1._M_current)->val).value = tVar3.value;
          (__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
          ).
          super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar11.micros = lVar4;
        iVar11.months = (int)uVar6;
        iVar11.days = (int)((ulong)uVar6 >> 0x20);
        tVar3 = duckdb::SubtractOperator::
                Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>(tVar3,iVar11);
      }
    }
    else {
      EquiWidthBinsInteger::Operation
                (&interpolated_values,expr,input_min.value,input_max.value,bin_count,false);
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ).
      super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (interpolated_values.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          interpolated_values.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pPVar7 = interpolated_values.
                 super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                 .
                 super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          _min_year = (timestamp_t)pPVar7->val;
          iVar1._M_current =
               (__return_storage_ptr__->
               super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
               ).
               super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
              ).
              super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
            ::_M_realloc_insert<duckdb::PrimitiveType<duckdb::timestamp_t>>
                      ((vector<duckdb::PrimitiveType<duckdb::timestamp_t>,std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>>>
                        *)__return_storage_ptr__,iVar1,
                       (PrimitiveType<duckdb::timestamp_t> *)&min_year);
          }
          else {
            ((iVar1._M_current)->val).value = (int64_t)_min_year;
            (__return_storage_ptr__->
            super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
            ).
            super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          pPVar7 = pPVar7 + 1;
        } while (pPVar7 != interpolated_values.
                           super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                           .
                           super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (interpolated_values.
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(interpolated_values.
                        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                        .
                        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    return __return_storage_ptr__;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  interpolated_values.
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&interpolated_values.
                 super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                 .
                 super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&interpolated_values,
             "equi_width_bucket does not support infinite or nan as min/max value","");
  InvalidInputException::InvalidInputException<>(this,expr,(string *)&interpolated_values);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static vector<PrimitiveType<timestamp_t>> Operation(const Expression &expr, timestamp_t input_min,
	                                                    timestamp_t input_max, idx_t bin_count, bool nice_rounding) {
		if (!Value::IsFinite(input_min) || !Value::IsFinite(input_max)) {
			throw InvalidInputException(expr, "equi_width_bucket does not support infinite or nan as min/max value");
		}

		if (!nice_rounding) {
			// if we are not doing nice rounding it is pretty simple - just interpolate between the timestamp values
			auto interpolated_values =
			    EquiWidthBinsInteger::Operation(expr, input_min.value, input_max.value, bin_count, false);

			vector<PrimitiveType<timestamp_t>> result;
			for (auto &val : interpolated_values) {
				result.push_back(timestamp_t(val.val));
			}
			return result;
		}
		// fetch the components of the timestamps
		int32_t min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros;
		int32_t max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros;
		GetTimestampComponents(input_min, min_year, min_month, min_day, min_hour, min_minute, min_sec, min_micros);
		GetTimestampComponents(input_max, max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros);

		// get the interval differences per component
		// note: these can be negative (except for the largest non-zero difference)
		interval_t interval_diff;
		interval_diff.months = (max_year - min_year) * Interval::MONTHS_PER_YEAR + (max_month - min_month);
		interval_diff.days = max_day - min_day;
		interval_diff.micros = (max_hour - min_hour) * Interval::MICROS_PER_HOUR +
		                       (max_minute - min_minute) * Interval::MICROS_PER_MINUTE +
		                       (max_sec - min_sec) * Interval::MICROS_PER_SEC + (max_micros - min_micros);

		double step_months = static_cast<double>(interval_diff.months) / static_cast<double>(bin_count);
		double step_days = static_cast<double>(interval_diff.days) / static_cast<int32_t>(bin_count);
		double step_micros = static_cast<double>(interval_diff.micros) / static_cast<double>(bin_count);
		// since we truncate the months/days, propagate any fractional component to the unit below (i.e. 0.2 months
		// becomes 6 days)
		if (step_months > 0) {
			double overflow_months = step_months - std::floor(step_months);
			step_days += overflow_months * Interval::DAYS_PER_MONTH;
		}
		if (step_days > 0) {
			double overflow_days = step_days - std::floor(step_days);
			step_micros += overflow_days * Interval::MICROS_PER_DAY;
		}
		interval_t step;
		step.months = static_cast<int32_t>(step_months);
		step.days = static_cast<int32_t>(step_days);
		step.micros = static_cast<int64_t>(step_micros);

		// now we make the max, and the step nice
		step = MakeIntervalNice(step);
		timestamp_t timestamp_val =
		    MakeTimestampNice(max_year, max_month, max_day, max_hour, max_minute, max_sec, max_micros, step);
		if (step.months <= 0 && step.days <= 0 && step.micros <= 0) {
			// interval must be at least one microsecond
			step.months = step.days = 0;
			step.micros = 1;
		}

		vector<PrimitiveType<timestamp_t>> result;
		while (timestamp_val.value >= input_min.value && result.size() < bin_count) {
			result.push_back(timestamp_val);
			timestamp_val = SubtractOperator::Operation<timestamp_t, interval_t, timestamp_t>(timestamp_val, step);
		}
		return result;
	}